

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

QPDFObjectHandle qpdf_oh_item_internal(qpdf_data qpdf,qpdf_oh item)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined1 this [8];
  uint uVar2;
  char *cstr;
  Pipeline *this_00;
  undefined4 in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  qpdf_data qpdf_00;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle ret;
  qpdf_error_code_e local_138 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  undefined1 local_128 [8];
  function<QPDFObjectHandle_(_qpdf_data_*)> local_120;
  int local_fc;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_90;
  long local_80;
  undefined8 uStack_78;
  function<QPDFObjectHandle_()> local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  qpdf_00 = (qpdf_data)CONCAT44(in_register_00000034,item);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<QPDFObjectHandle_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1593:9)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<QPDFObjectHandle_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1593:9)>
             ::_M_manager;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<QPDFObjectHandle_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1594:9)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<QPDFObjectHandle_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1594:9)>
             ::_M_manager;
  std::function<QPDFObjectHandle_()>::function(&local_68,(function<QPDFObjectHandle_()> *)&local_48)
  ;
  std::function<QPDFObjectHandle_(QPDFObjectHandle_&)>::function
            ((function<QPDFObjectHandle_(QPDFObjectHandle_&)> *)&local_90,
             (function<QPDFObjectHandle_(QPDFObjectHandle_&)> *)&local_f8);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_d8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 0x18) = uStack_78;
  if (local_80 != 0) {
    *(void **)local_d8._M_unused._0_8_ = local_90._M_unused._M_object;
    *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = local_90._8_8_;
    *(long *)((long)local_d8._M_unused._0_8_ + 0x10) = local_80;
    local_80 = 0;
    uStack_78 = 0;
  }
  *(undefined4 *)((long)local_d8._M_unused._0_8_ + 0x20) = in_EDX;
  pcStack_c0 = std::
               _Function_handler<QPDFObjectHandle_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<QPDFObjectHandle_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  ret.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ret.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_128 = (undefined1  [8])&ret;
  std::function<QPDFObjectHandle_(_qpdf_data_*)>::function
            (&local_120,(function<QPDFObjectHandle_(_qpdf_data_*)> *)&local_d8);
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_b8._M_unused._0_8_ = local_128;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_b8._M_unused._0_8_ + 0x20) = local_120._M_invoker;
  if (local_120.super__Function_base._M_manager != (_Manager_type)0x0) {
    *(void **)((long)local_b8._M_unused._0_8_ + 8) =
         local_120.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)local_b8._M_unused._0_8_ + 0x10) =
         local_120.super__Function_base._M_functor._8_8_;
    *(_Manager_type *)((long)local_b8._M_unused._0_8_ + 0x18) =
         local_120.super__Function_base._M_manager;
    local_120.super__Function_base._M_manager = (_Manager_type)0x0;
    local_120._M_invoker = (_Invoker_type)0x0;
  }
  pcStack_a0 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar2 = trap_errors(qpdf_00,(function<void_(_qpdf_data_*)> *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::_Function_base::~_Function_base(&local_120.super__Function_base);
  _Var1 = ret.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  if (uVar2 < 2) {
    ret.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ret.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var1._M_pi;
    ret.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    if (qpdf_00->silence_errors == false) {
      if (qpdf_00->oh_error_occurred == false) {
        local_138[0] = qpdf_e_internal;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_128,
                   (qpdf_00->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_fc = 0;
        std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
        emplace_back<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                  ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf_00->warnings,local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   (char (*) [1])0x22a008,&local_fc,
                   (char (*) [129])
                   "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                  );
        std::__cxx11::string::~string((string *)local_128);
        qpdf_00->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_128,SUB41(local_138[0],0));
      this = local_128;
      cstr = (char *)(**(code **)(*(long *)(qpdf_00->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_120);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130);
    }
    std::function<QPDFObjectHandle_()>::operator()((function<QPDFObjectHandle_()> *)qpdf);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)qpdf;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static QPDFObjectHandle
qpdf_oh_item_internal(qpdf_data qpdf, qpdf_oh item)
{
    return do_with_oh<QPDFObjectHandle>(
        qpdf,
        item,
        []() { return QPDFObjectHandle::newNull(); },
        [](QPDFObjectHandle& o) { return o; });
}